

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

int quantifier_type_num(QuantNode *q)

{
  QuantNode *q_local;
  
  if (q->greedy == 0) {
    if (q->lower == 0) {
      if (q->upper == 1) {
        return 3;
      }
      if (q->upper == -1) {
        return 4;
      }
    }
    else if ((q->lower == 1) && (q->upper == -1)) {
      return 5;
    }
  }
  else if (q->lower == 0) {
    if (q->upper == 1) {
      return 0;
    }
    if (q->upper == -1) {
      return 1;
    }
  }
  else if ((q->lower == 1) && (q->upper == -1)) {
    return 2;
  }
  return -1;
}

Assistant:

static int
quantifier_type_num(QuantNode* q)
{
  if (q->greedy) {
    if (q->lower == 0) {
      if (q->upper == 1) return 0;
      else if (IS_INFINITE_REPEAT(q->upper)) return 1;
    }
    else if (q->lower == 1) {
      if (IS_INFINITE_REPEAT(q->upper)) return 2;
    }
  }
  else {
    if (q->lower == 0) {
      if (q->upper == 1) return 3;
      else if (IS_INFINITE_REPEAT(q->upper)) return 4;
    }
    else if (q->lower == 1) {
      if (IS_INFINITE_REPEAT(q->upper)) return 5;
    }
  }
  return -1;
}